

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int idaLs_AccessLMemBCur
              (void *ida_mem,char *fname,IDAMem *IDA_mem,IDAadjMem *IDAADJ_mem,IDABMem *IDAB_mem,
              IDALsMemB *idalsB_mem)

{
  long *in_RCX;
  long *in_RDX;
  char *in_RSI;
  long in_RDI;
  long *in_R8;
  undefined8 *in_R9;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-1,0xa8b,in_RSI,
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else {
    *in_RDX = in_RDI;
    if (*(int *)(*in_RDX + 0x848) == 0) {
      IDAProcessError((IDAMem)*in_RDX,-0x65,0xa94,in_RSI,
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                      ,"Illegal attempt to call before calling IDAAdjInit.");
      local_4 = -0x65;
    }
    else {
      *in_RCX = *(long *)(*in_RDX + 0x840);
      if (*(long *)(*in_RCX + 0x40) == 0) {
        IDAProcessError((IDAMem)*in_RDX,-0x66,0xa9d,in_RSI,
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                        ,"Linear solver memory is NULL for the backward integration.");
        local_4 = -0x66;
      }
      else {
        *in_R8 = *(long *)(*in_RCX + 0x40);
        if (*(long *)(*in_R8 + 0x48) == 0) {
          IDAProcessError((IDAMem)*in_RDX,-0x66,0xaa6,in_RSI,
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                          ,"Linear solver memory is NULL for the backward integration.");
          local_4 = -0x66;
        }
        else {
          *in_R9 = *(undefined8 *)(*in_R8 + 0x48);
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int idaLs_AccessLMemBCur(void* ida_mem, const char* fname, IDAMem* IDA_mem,
                         IDAadjMem* IDAADJ_mem, IDABMem* IDAB_mem,
                         IDALsMemB* idalsB_mem)
{
  /* access IDAMem structure */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  *IDA_mem = (IDAMem)ida_mem;

  /* access IDAadjMem structure */
  if ((*IDA_mem)->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(*IDA_mem, IDALS_NO_ADJ, __LINE__, fname, __FILE__,
                    MSG_LS_NO_ADJ);
    return (IDALS_NO_ADJ);
  }
  *IDAADJ_mem = (*IDA_mem)->ida_adj_mem;

  /* get current backward problem */
  if ((*IDAADJ_mem)->ia_bckpbCrt == NULL)
  {
    IDAProcessError(*IDA_mem, IDALS_LMEMB_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_LMEMB_NULL);
    return (IDALS_LMEMB_NULL);
  }
  *IDAB_mem = (*IDAADJ_mem)->ia_bckpbCrt;

  /* access IDALsMemB structure */
  if ((*IDAB_mem)->ida_lmem == NULL)
  {
    IDAProcessError(*IDA_mem, IDALS_LMEMB_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_LMEMB_NULL);
    return (IDALS_LMEMB_NULL);
  }
  *idalsB_mem = (IDALsMemB)((*IDAB_mem)->ida_lmem);

  return (IDALS_SUCCESS);
}